

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O2

void daemon_main(int listen_fd,int close_notify_fd,char *tempdir)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  pthread_t tid;
  pthread_attr_t thattr;
  
  uVar2 = sysconf(4);
  while( true ) {
    iVar1 = (int)uVar2;
    uVar3 = iVar1 - 1;
    uVar2 = (ulong)uVar3;
    if (iVar1 < 4) break;
    if (listen_fd != uVar3 && close_notify_fd != uVar3) {
      close(uVar3);
    }
  }
  pthread_attr_init((pthread_attr_t *)&thattr);
  pthread_attr_setdetachstate((pthread_attr_t *)&thattr,1);
  iVar1 = pthread_create(&tid,(pthread_attr_t *)&thattr,daemon_close_notify_thread,
                         (void *)(ulong)(uint)close_notify_fd);
  if (iVar1 == 0) {
    do {
      do {
        uVar3 = accept(listen_fd,(sockaddr *)0x0,(socklen_t *)0x0);
      } while (uVar3 == 0xffffffff);
      iVar1 = pthread_create(&tid,(pthread_attr_t *)&thattr,daemon_conn_thread,(void *)(ulong)uVar3)
      ;
    } while (iVar1 == 0);
  }
  dief("pthread_create failed");
}

Assistant:

__attribute__((noreturn)) static void daemon_main(int listen_fd, int close_notify_fd, const char *tempdir)
{
    pthread_t tid;
    pthread_attr_t thattr;
    int sock_fd;

    { /* close all descriptors (except STDIN, STDOUT, STRERR, listen_fd, close_notify_fd) */
        int fd = (int)sysconf(_SC_OPEN_MAX) - 1;
        for (; fd > 2; --fd) {
            if (fd == listen_fd || fd == close_notify_fd)
                continue;
            close(fd);
        }
    }

    pthread_attr_init(&thattr);
    pthread_attr_setdetachstate(&thattr, 1);

    if (pthread_create(&tid, &thattr, daemon_close_notify_thread, (char *)NULL + close_notify_fd) != 0)
        dief("pthread_create failed");

    while (1) {
        while ((sock_fd = accept(listen_fd, NULL, NULL)) == -1)
            ;
        if (pthread_create(&tid, &thattr, daemon_conn_thread, (char *)NULL + sock_fd) != 0)
            dief("pthread_create failed");
    }
}